

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void api_suite::api_contains(void)

{
  const_iterator ptVar1;
  key_type local_5c;
  map_array<int,_int,_4UL,_std::less<int>_> local_58;
  
  local_58.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems + 1;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  local_58.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.tail = (pointer)&local_58.super_map_view<int,_int,_4UL,_std::less<int>_>;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0xb;
  local_58.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 1;
  local_5c = 10;
  local_58.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.head = (pointer)&local_58;
  ptVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::find(&local_58,&local_5c);
  boost::detail::test_impl
            ("!array.contains(10)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x7b,"void api_suite::api_contains()",
             ptVar1 == local_58.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail);
  local_5c = 0xb;
  ptVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::find(&local_58,&local_5c);
  boost::detail::test_impl
            ("array.contains(11)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x7c,"void api_suite::api_contains()",
             ptVar1 != local_58.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail);
  local_5c = 0xc;
  ptVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::find(&local_58,&local_5c);
  boost::detail::test_impl
            ("!array.contains(12)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x7d,"void api_suite::api_contains()",
             ptVar1 == local_58.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}